

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void MIR_set_gen_interface(MIR_context_t ctx,MIR_item_t func_item)

{
  VARR_call_ref_t *pVVar1;
  MIR_func_t pMVar2;
  bool bVar3;
  bool bVar4;
  void *to;
  char *pcVar5;
  uint8_t *addr_00;
  gen_ctx *called_func;
  uint8_t **ppuVar6;
  size_t sVar7;
  uint8_t *puVar8;
  bool bVar9;
  uint8_t *addr;
  int local_4c;
  gen_ctx *local_48;
  MIR_context_t local_40;
  uint8_t *local_38;
  
  if (func_item != (MIR_item_t)0x0) {
    generate_func_code(ctx,func_item,1);
    return;
  }
  called_func = ctx->gen_ctx;
  pVVar1 = called_func->target_ctx->call_refs;
  if (pVVar1 == (VARR_call_ref_t *)0x0) {
LAB_0015488b:
    MIR_set_gen_interface_cold_2();
    if (called_func != (gen_ctx *)0x0) {
      to = _MIR_get_wrapper(ctx,(MIR_item_t_conflict)called_func,
                            generate_func_and_redirect_to_func_code);
      _MIR_redirect_thunk(ctx,*(void **)&called_func->addr_insn_p,to);
      return;
    }
    return;
  }
  sVar7 = pVVar1->els_num;
  if (sVar7 != 0) {
    ppuVar6 = &pVVar1->varr->call_addr;
    local_48 = called_func;
    local_40 = ctx;
    do {
      pMVar2 = (((call_ref_t *)(ppuVar6 + -1))->ref_func_item->u).func;
      local_38 = (uint8_t *)pMVar2->machine_code;
      addr_00 = *ppuVar6;
      local_4c = *(int *)(addr_00 + 2);
      if (*addr_00 == '@') {
        puVar8 = addr_00 + (long)local_4c + 6;
        bVar9 = puVar8 == local_38;
        bVar3 = ((long)local_38 - (long)(addr_00 + 6)) + 0x80000000U >> 0x20 != 0;
        if (bVar3 || bVar9) {
          bVar4 = false;
          if ((called_func->debug_file != (FILE *)0x0) &&
             (bVar4 = false, 1 < called_func->debug_level)) {
            ctx = _stderr;
            fprintf((FILE *)_stderr,
                    "Failing to make direct 32-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
                    ,pMVar2->name,addr_00,puVar8);
            bVar4 = false;
            called_func = local_48;
          }
        }
        else {
          local_4c = (int)((long)local_38 - (long)(addr_00 + 6));
          ctx = local_40;
          _MIR_change_code(local_40,addr_00 + 2,(uint8_t *)&local_4c,4);
          called_func = local_48;
          bVar4 = true;
        }
        if (!bVar3 && !bVar9) goto LAB_001547ac;
      }
      else {
        if (*addr_00 != 0xff) {
          __assert_fail("call_addr[0] == 0x40",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0xbb6,"void target_change_to_direct_calls(MIR_context_t)");
        }
        puVar8 = *(uint8_t **)(addr_00 + (long)local_4c + 6);
        if (local_38 != puVar8) {
          addr_00 = addr_00 + (long)local_4c + 6;
          ctx = local_40;
          _MIR_change_code(local_40,addr_00,(uint8_t *)&local_38,8);
          bVar4 = false;
          called_func = local_48;
LAB_001547ac:
          if ((called_func->debug_file != (FILE *)0x0) && (1 < called_func->debug_level)) {
            pcVar5 = "32";
            if (!bVar4) {
              pcVar5 = "64";
            }
            ctx = _stderr;
            fprintf((FILE *)_stderr,
                    "Making direct %s-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
                    ,pcVar5,pMVar2->name,addr_00,puVar8,local_38);
            called_func = local_48;
          }
        }
      }
      ppuVar6 = ppuVar6 + 2;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
    pVVar1 = called_func->target_ctx->call_refs;
    if ((pVVar1 == (VARR_call_ref_t *)0x0) || (pVVar1->varr == (call_ref_t *)0x0)) {
      MIR_set_gen_interface_cold_1();
      goto LAB_0015488b;
    }
    pVVar1->els_num = 0;
  }
  return;
}

Assistant:

void MIR_set_gen_interface (MIR_context_t ctx, MIR_item_t func_item) {
  if (func_item == NULL) { /* finish setting interfaces */
    target_change_to_direct_calls (ctx);
  } else {
    MIR_gen (ctx, func_item);
  }
}